

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_router_interface.c
# Opt level: O2

void dlep_router_apply_interface_settings(dlep_router_if *interf)

{
  list_entity *plVar1;
  avl_tree *paVar2;
  avl_tree *paVar3;
  
  oonf_packet_apply_managed(&(interf->interf).udp,&(interf->interf).udp_config);
  _cleanup_interface(interf);
  if ((interf->connect_to_addr)._type == '\0') {
    oonf_timer_stop(&interf->_connect_to_watchdog);
  }
  else {
    _connect_to_setup(interf);
  }
  paVar2 = dlep_extension_get_tree();
  while( true ) {
    paVar2 = (avl_tree *)(paVar2->list_head).next;
    plVar1 = (paVar2->list_head).prev;
    paVar3 = dlep_extension_get_tree();
    if (plVar1 == (paVar3->list_head).prev) break;
    plVar1 = paVar2[-1].list_head.next;
    if (plVar1 != (list_entity *)0x0) {
      (*(code *)plVar1)(interf);
    }
  }
  return;
}

Assistant:

void
dlep_router_apply_interface_settings(struct dlep_router_if *interf) {
  struct dlep_extension *ext;

  oonf_packet_apply_managed(&interf->interf.udp, &interf->interf.udp_config);

  _cleanup_interface(interf);

  if (!netaddr_is_unspec(&interf->connect_to_addr)) {
    _connect_to_setup(interf);
  }
  else {
    oonf_timer_stop(&interf->_connect_to_watchdog);
  }

  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    if (ext->cb_session_apply_router) {
      ext->cb_session_apply_router(&interf->interf.session);
    }
  }
}